

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadGridMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  pointer *ppGVar1;
  undefined4 uVar2;
  string *psVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  GridMeshNode *this_00;
  size_t in_RCX;
  undefined8 *in_RDX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *sig;
  iterator __position;
  uchar *in_R8;
  size_t in_R9;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  Ref<embree::XML> animation;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> grids;
  Ref<embree::SceneGraph::MaterialNode> material;
  undefined1 local_b0 [16];
  undefined1 auStack_a0 [8];
  Vec3fa *local_98;
  undefined1 local_90 [24];
  undefined1 local_78 [40];
  undefined1 local_50 [32];
  
  psVar3 = (string *)*in_RDX;
  local_b0._0_8_ = auStack_a0;
  local_90._16_8_ = xml;
  local_78._32_8_ = in_RDX;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"material","");
  XML::child((XML *)local_78,psVar3);
  loadMaterial((XMLLoader *)(local_50 + 0x10),(Ref<embree::XML> *)local_90._16_8_);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)local_78._0_8_)[3])();
  }
  if ((undefined1 *)local_b0._0_8_ != auStack_a0) {
    operator_delete((void *)local_b0._0_8_);
  }
  this_00 = (GridMeshNode *)operator_new(0xa8);
  local_50._8_8_ = local_50._16_8_;
  local_90._8_8_ = local_50._16_8_;
  if ((long *)local_50._16_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_50._16_8_ + 0x10))(local_50._16_8_);
  }
  SceneGraph::GridMeshNode::GridMeshNode
            (this_00,(Ref<embree::SceneGraph::MaterialNode> *)(local_50 + 8),
             (BBox1f)0x3f80000000000000,0);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if ((long *)local_50._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_50._8_8_ + 0x18))();
  }
  psVar3 = *(string **)local_78._32_8_;
  local_b0._0_8_ = auStack_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"animated_positions","");
  XML::childOpt((XML *)local_90,psVar3);
  if ((undefined1 *)local_b0._0_8_ != auStack_a0) {
    operator_delete((void *)local_b0._0_8_);
  }
  local_50._24_8_ = this;
  if ((XML *)local_90._0_8_ == (XML *)0x0) {
    psVar3 = *(string **)local_78._32_8_;
    local_78._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"positions","");
    XML::childOpt((XML *)local_50,psVar3);
    loadVec3faArray((avector<Vec3fa> *)local_b0,(XMLLoader *)local_90._16_8_,
                    (Ref<embree::XML> *)local_50);
    std::
    vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                *)&this_00->positions,
               (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
               local_b0);
    alignedFree(local_98);
    stack0xffffffffffffff58 = (undefined1  [16])0x0;
    local_98 = (Vec3fa *)0x0;
    if ((long *)local_50._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_50._0_8_ + 0x18))();
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_);
    }
    if ((XML *)local_90._0_8_ == (XML *)0x0) goto LAB_001807eb;
  }
  else if ((((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
            (local_90._0_8_ + 0x80))->
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish !=
           (((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
            (local_90._0_8_ + 0x80))->
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>)
           ._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      XML::child((XML *)local_78,local_90._0_8_);
      loadVec3faArray((avector<Vec3fa> *)local_b0,(XMLLoader *)local_90._16_8_,
                      (Ref<embree::XML> *)local_78);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)&this_00->positions,(avector<Vec3fa> *)local_b0);
      alignedFree(local_98);
      stack0xffffffffffffff58 = (undefined1  [16])0x0;
      local_98 = (Vec3fa *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(*(_func_int ***)local_78._0_8_)[3])();
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                      *)(local_90._0_8_ + 0x80))->
                                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                      *)(local_90._0_8_ + 0x80))->
                                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  (*((RefCount *)local_90._0_8_)->_vptr_RefCount[3])(local_90._0_8_);
LAB_001807eb:
  psVar3 = *(string **)local_78._32_8_;
  local_b0._0_8_ = auStack_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"grids","");
  XML::childOpt((XML *)local_90,psVar3);
  __position._M_current = (Grid *)local_90._16_8_;
  loadVec4iArray((vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *)local_78,
                 (XMLLoader *)local_90._16_8_,(Ref<embree::XML> *)local_90);
  sig = extraout_RDX;
  if ((XML *)local_90._0_8_ != (XML *)0x0) {
    (*((RefCount *)local_90._0_8_)->_vptr_RefCount[3])();
    sig = extraout_RDX_00;
  }
  if ((undefined1 *)local_b0._0_8_ != auStack_a0) {
    operator_delete((void *)local_b0._0_8_);
    sig = extraout_RDX_01;
  }
  if (local_78._8_8_ != local_78._0_8_) {
    lVar6 = 8;
    uVar7 = 0;
    do {
      local_b0._0_8_ = *(undefined8 *)(local_78._0_8_ + lVar6 + -8);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)((long)(_func_int ***)local_78._0_8_ + lVar6);
      auVar8 = pshuflw(auVar8,auVar8,0xe8);
      uVar2 = auVar8._0_4_;
      local_b0._8_4_ = uVar2;
      __position._M_current =
           (this_00->grids).
           super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_00->grids).
          super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
        ::_M_realloc_insert<embree::SceneGraph::GridMeshNode::Grid>
                  (&this_00->grids,__position,(Grid *)local_b0);
        sig = extraout_RDX_02;
      }
      else {
        (__position._M_current)->resX = (short)uVar2;
        (__position._M_current)->resY = (short)((uint)uVar2 >> 0x10);
        *(undefined8 *)__position._M_current = local_b0._0_8_;
        ppGVar1 = &(this_00->grids).
                   super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppGVar1 = *ppGVar1 + 1;
      }
      uVar7 = uVar7 + 1;
      in_RCX = (long)(local_78._8_8_ - local_78._0_8_) >> 4;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < in_RCX);
  }
  SceneGraph::GridMeshNode::verify
            (this_00,(EVP_PKEY_CTX *)__position._M_current,sig,in_RCX,in_R8,in_R9);
  uVar5 = local_50._24_8_;
  *(GridMeshNode **)local_50._24_8_ = this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  uVar4 = local_90._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete((void *)local_78._0_8_);
  }
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  if (uVar4 != 0) {
    (**(code **)(*(long *)uVar4 + 0x18))(uVar4);
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)uVar5;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadGridMesh(const Ref<XML>& xml) 
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::GridMeshNode> mesh = new SceneGraph::GridMeshNode(material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3faArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions")));
    }

    std::vector<Vec4i> grids = loadVec4iArray(xml->childOpt("grids"));
    for (size_t i=0; i<grids.size(); i++) 
      mesh->grids.push_back(SceneGraph::GridMeshNode::Grid(grids[i].x,grids[i].y,grids[i].z,grids[i].w));
    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }